

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_pattern(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing pattern : 10 of 15 functions ...\n");
  }
  iVar1 = test_xmlPatternFromRoot();
  iVar2 = test_xmlPatternGetStreamCtxt();
  iVar3 = test_xmlPatternMatch();
  iVar4 = test_xmlPatternMaxDepth();
  iVar5 = test_xmlPatternMinDepth();
  iVar6 = test_xmlPatternStreamable();
  iVar7 = test_xmlPatterncompile();
  iVar8 = test_xmlStreamPop();
  iVar9 = test_xmlStreamPush();
  iVar10 = test_xmlStreamPushAttr();
  iVar11 = test_xmlStreamPushNode();
  iVar12 = test_xmlStreamWantsAnyNode();
  uVar13 = iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 
                                                  + iVar1;
  if (uVar13 != 0) {
    printf("Module pattern: %d errors\n",(ulong)uVar13);
  }
  return uVar13;
}

Assistant:

static int
test_pattern(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing pattern : 10 of 15 functions ...\n");
    test_ret += test_xmlPatternFromRoot();
    test_ret += test_xmlPatternGetStreamCtxt();
    test_ret += test_xmlPatternMatch();
    test_ret += test_xmlPatternMaxDepth();
    test_ret += test_xmlPatternMinDepth();
    test_ret += test_xmlPatternStreamable();
    test_ret += test_xmlPatterncompile();
    test_ret += test_xmlStreamPop();
    test_ret += test_xmlStreamPush();
    test_ret += test_xmlStreamPushAttr();
    test_ret += test_xmlStreamPushNode();
    test_ret += test_xmlStreamWantsAnyNode();

    if (test_ret != 0)
	printf("Module pattern: %d errors\n", test_ret);
    return(test_ret);
}